

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# die_if_null.cc
# Opt level: O0

void absl::lts_20240722::log_internal::DieBecauseNull(char *file,int line,char *exprtext)

{
  LogMessage *pLVar1;
  undefined1 auVar2 [12];
  AlphaNum local_108;
  AlphaNum local_d8;
  AlphaNum local_a8;
  undefined1 local_78 [40];
  char local_50 [12];
  undefined4 local_44;
  undefined8 local_40;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  char *local_20;
  char *exprtext_local;
  char *pcStack_10;
  int line_local;
  char *file_local;
  
  local_20 = exprtext;
  exprtext_local._4_4_ = line;
  pcStack_10 = file;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/log/die_if_null.cc"
             ,0x1a);
  pLVar1 = LogMessage::InternalStream((LogMessage *)local_38);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(local_78 + 0x20),pcStack_10);
  pLVar1 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::AtLocation
                     (pLVar1,local_78._32_8_,local_50._0_8_,exprtext_local._4_4_);
  AlphaNum::AlphaNum(&local_a8,"Check failed: \'");
  AlphaNum::AlphaNum(&local_d8,local_20);
  AlphaNum::AlphaNum(&local_108,"\' Must be non-null");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_78,&local_a8,&local_d8);
  pLVar1 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(string *)local_78);
  Voidify::operator&&(&local_21,pLVar1);
  std::__cxx11::string::~string((string *)local_78);
  auVar2 = absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  local_44 = auVar2._8_4_;
  local_40 = auVar2._0_8_;
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  return;
}

Assistant:

void DieBecauseNull(const char* file, int line, const char* exprtext) {
  LOG(FATAL).AtLocation(file, line)
      << absl::StrCat("Check failed: '", exprtext, "' Must be non-null");
}